

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_viewOps.cpp
# Opt level: O3

string_view
gmlc::utilities::string_viewOps::getTailString_any
          (string_view input,string_view separationCharacters)

{
  size_type sVar1;
  string_view sVar2;
  basic_string_view<char,_std::char_traits<char>_> local_18;
  
  local_18._M_str = input._M_str;
  local_18._M_len = input._M_len;
  sVar1 = std::basic_string_view<char,_std::char_traits<char>_>::find_last_of
                    (&local_18,separationCharacters._M_str,0xffffffffffffffff,
                     separationCharacters._M_len);
  sVar2._M_len = local_18._M_len - (sVar1 + 1);
  sVar2._M_str = local_18._M_str + sVar1 + 1;
  return sVar2;
}

Assistant:

std::string_view getTailString_any(
    std::string_view input,
    std::string_view separationCharacters) noexcept
{
    auto sepLoc = input.find_last_of(separationCharacters);
    if (sepLoc != std::string_view::npos) {
        input.remove_prefix(sepLoc + 1);
    }
    return input;
}